

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClosedFileInputSource.cc
# Opt level: O0

void __thiscall ClosedFileInputSource::~ClosedFileInputSource(ClosedFileInputSource *this)

{
  ClosedFileInputSource *this_local;
  
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__ClosedFileInputSource_006f03c8;
  std::shared_ptr<FileInputSource>::~shared_ptr(&this->fis);
  std::__cxx11::string::~string((string *)&this->filename);
  InputSource::~InputSource(&this->super_InputSource);
  return;
}

Assistant:

ClosedFileInputSource::~ClosedFileInputSource() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}